

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void COVER_warnOnSmallCorpus(size_t maxDictSize,size_t nbDmers,int displayLevel)

{
  int in_EDX;
  ulong in_RSI;
  ulong in_RDI;
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double ratio;
  
  auVar2._8_4_ = (int)(in_RSI >> 0x20);
  auVar2._0_8_ = in_RSI;
  auVar2._12_4_ = 0x45300000;
  auVar3._8_4_ = (int)(in_RDI >> 0x20);
  auVar3._0_8_ = in_RDI;
  auVar3._12_4_ = 0x45300000;
  dVar1 = ((auVar2._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)in_RSI) - 4503599627370496.0)) /
          ((auVar3._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)in_RDI) - 4503599627370496.0));
  if ((dVar1 < 10.0) && (0 < in_EDX)) {
    fprintf(_stderr,
            "WARNING: The maximum dictionary size %u is too large compared to the source size %u! size(source)/size(dictionary) = %f, but it should be >= 10! This may lead to a subpar dictionary! We recommend training on sources at least 10x, and preferably 100x the size of the dictionary! \n"
            ,dVar1,in_RDI & 0xffffffff,in_RSI & 0xffffffff);
    fflush(_stderr);
  }
  return;
}

Assistant:

void COVER_warnOnSmallCorpus(size_t maxDictSize, size_t nbDmers, int displayLevel)
{
  const double ratio = (double)nbDmers / (double)maxDictSize;
  if (ratio >= 10) {
      return;
  }
  LOCALDISPLAYLEVEL(displayLevel, 1,
                    "WARNING: The maximum dictionary size %u is too large "
                    "compared to the source size %u! "
                    "size(source)/size(dictionary) = %f, but it should be >= "
                    "10! This may lead to a subpar dictionary! We recommend "
                    "training on sources at least 10x, and preferably 100x "
                    "the size of the dictionary! \n", (U32)maxDictSize,
                    (U32)nbDmers, ratio);
}